

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcacheoptimizer.cpp
# Opt level: O3

void meshopt_optimizeVertexCacheFifo
               (uint *destination,uint *indices,size_t index_count,size_t vertex_count,
               uint cache_size)

{
  int *piVar1;
  size_t __n;
  void **ppvVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  int iVar11;
  uint *puVar12;
  void *__dest;
  void *__s;
  void *pvVar13;
  void *__s_00;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  TriangleAdjacency adjacency;
  TriangleAdjacency local_118;
  meshopt_Allocator local_f8;
  
  memset(&local_f8,0,200);
  lVar25 = 0;
  if (vertex_count != 0 && index_count != 0) {
    if (destination == indices) {
      sVar19 = 0xffffffffffffffff;
      if (index_count < 0x4000000000000000) {
        sVar19 = index_count * 4;
      }
      puVar12 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)(sVar19);
      local_f8.count = 1;
      local_f8.blocks[0] = puVar12;
      memcpy(puVar12,indices,index_count * 4);
      indices = puVar12;
    }
    local_118.counts = (uint *)0x0;
    local_118.offsets = (uint *)0x0;
    local_118.data = (uint *)0x0;
    meshopt::buildTriangleAdjacency(&local_118,indices,index_count,vertex_count,&local_f8);
    __n = vertex_count * 4;
    sVar19 = 0xffffffffffffffff;
    if (vertex_count < 0x4000000000000000) {
      sVar19 = __n;
    }
    __dest = (*meshopt_Allocator::StorageT<void>::allocate)(sVar19);
    sVar10 = local_f8.count;
    puVar12 = local_118.counts;
    ppvVar2 = local_f8.blocks + local_f8.count;
    local_f8.count = local_f8.count + 1;
    *ppvVar2 = __dest;
    memcpy(__dest,local_118.counts,__n);
    __s = (*meshopt_Allocator::StorageT<void>::allocate)(sVar19);
    local_f8.count = sVar10 + 2;
    local_f8.blocks[sVar10 + 1] = __s;
    memset(__s,0,__n);
    sVar19 = 0xffffffffffffffff;
    if (index_count < 0x4000000000000000) {
      sVar19 = index_count * 4;
    }
    pvVar13 = (*meshopt_Allocator::StorageT<void>::allocate)(sVar19);
    local_f8.count = sVar10 + 3;
    local_f8.blocks[sVar10 + 2] = pvVar13;
    __s_00 = (*meshopt_Allocator::StorageT<void>::allocate)(index_count / 3);
    local_f8.blocks[sVar10 + 3] = __s_00;
    lVar25 = sVar10 + 4;
    memset(__s_00,0,index_count / 3);
    iVar11 = cache_size + 1;
    uVar20 = 1;
    uVar15 = 0;
    iVar14 = 0;
    uVar23 = 0;
    do {
      uVar3 = puVar12[uVar15];
      uVar24 = (ulong)uVar23;
      if ((ulong)uVar3 != 0) {
        uVar4 = local_118.offsets[uVar15];
        lVar17 = 0;
        uVar24 = (ulong)uVar23;
        do {
          uVar5 = *(uint *)((long)local_118.data + lVar17 + (ulong)uVar4 * 4);
          uVar15 = (ulong)uVar5;
          if (*(char *)((long)__s_00 + uVar15) == '\0') {
            uVar6 = indices[uVar5 * 3];
            uVar21 = (ulong)uVar6;
            uVar5 = indices[uVar5 * 3 + 1];
            uVar26 = (ulong)uVar5;
            uVar7 = indices[uVar15 * 3 + 2 & 0xffffffff];
            uVar18 = (ulong)uVar7;
            destination[(uint)(iVar14 * 3)] = uVar6;
            destination[iVar14 * 3 + 1] = uVar5;
            destination[iVar14 * 3 + 2] = uVar7;
            iVar22 = (int)uVar24;
            *(uint *)((long)pvVar13 + uVar24 * 4) = uVar6;
            *(uint *)((long)pvVar13 + (ulong)(iVar22 + 1) * 4) = uVar5;
            *(uint *)((long)pvVar13 + (ulong)(iVar22 + 2) * 4) = uVar7;
            piVar1 = (int *)((long)__dest + uVar21 * 4);
            *piVar1 = *piVar1 + -1;
            piVar1 = (int *)((long)__dest + uVar26 * 4);
            *piVar1 = *piVar1 + -1;
            piVar1 = (int *)((long)__dest + uVar18 * 4);
            *piVar1 = *piVar1 + -1;
            if (cache_size < (uint)(iVar11 - *(int *)((long)__s + uVar21 * 4))) {
              *(int *)((long)__s + uVar21 * 4) = iVar11;
              iVar11 = iVar11 + 1;
            }
            if (cache_size < (uint)(iVar11 - *(int *)((long)__s + uVar26 * 4))) {
              *(int *)((long)__s + uVar26 * 4) = iVar11;
              iVar11 = iVar11 + 1;
            }
            if (cache_size < (uint)(iVar11 - *(int *)((long)__s + uVar18 * 4))) {
              *(int *)((long)__s + uVar18 * 4) = iVar11;
              iVar11 = iVar11 + 1;
            }
            iVar14 = iVar14 + 1;
            uVar24 = (ulong)(iVar22 + 3);
            *(undefined1 *)((long)__s_00 + uVar15) = 1;
          }
          lVar17 = lVar17 + 4;
        } while ((ulong)uVar3 << 2 != lVar17);
      }
      if (uVar23 == (uint)uVar24) {
LAB_00178894:
        uVar15 = uVar20;
        if ((uint)uVar24 != 0) {
          do {
            uVar24 = uVar24 - 1;
            uVar15 = (ulong)*(uint *)((long)pvVar13 + (uVar24 & 0xffffffff) * 4);
            if (*(int *)((long)__dest + uVar15 * 4) != 0) goto LAB_001788e3;
            uVar15 = uVar20;
          } while (uVar24 != 0);
        }
        while( true ) {
          if (vertex_count <= uVar15) goto LAB_001784ea;
          if (*(int *)((long)__dest + uVar15 * 4) != 0) break;
          uVar15 = (ulong)((int)uVar15 + 1);
        }
        uVar24 = 0;
        uVar20 = uVar15;
      }
      else {
        lVar17 = (ulong)uVar23 << 2;
        uVar15 = 0xffffffff;
        iVar22 = -1;
        do {
          uVar18 = (ulong)*(uint *)((long)pvVar13 + lVar17);
          iVar8 = *(int *)((long)__dest + uVar18 * 4);
          if (iVar8 != 0) {
            iVar9 = *(int *)((long)__s + uVar18 * 4);
            iVar16 = iVar11 - iVar9;
            if (cache_size < (uint)((iVar11 + iVar8 * 2) - iVar9)) {
              iVar16 = 0;
            }
            if (iVar22 < iVar16) {
              uVar15 = uVar18;
              iVar22 = iVar16;
            }
          }
          lVar17 = lVar17 + 4;
        } while (uVar24 * 4 - lVar17 != 0);
        if ((int)uVar15 == -1) goto LAB_00178894;
      }
LAB_001788e3:
      uVar23 = (uint)uVar24;
    } while ((int)uVar15 != -1);
  }
LAB_001784ea:
  while (lVar25 != 0) {
    (*meshopt_Allocator::StorageT<void>::deallocate)(local_f8.blocks[lVar25 + -1]);
    lVar25 = lVar25 + -1;
  }
  return;
}

Assistant:

void meshopt_optimizeVertexCacheFifo(unsigned int* destination, const unsigned int* indices, size_t index_count, size_t vertex_count, unsigned int cache_size)
{
	using namespace meshopt;

	assert(index_count % 3 == 0);
	assert(cache_size >= 3);

	meshopt_Allocator allocator;

	// guard for empty meshes
	if (index_count == 0 || vertex_count == 0)
		return;

	// support in-place optimization
	if (destination == indices)
	{
		unsigned int* indices_copy = allocator.allocate<unsigned int>(index_count);
		memcpy(indices_copy, indices, index_count * sizeof(unsigned int));
		indices = indices_copy;
	}

	size_t face_count = index_count / 3;

	// build adjacency information
	TriangleAdjacency adjacency = {};
	buildTriangleAdjacency(adjacency, indices, index_count, vertex_count, allocator);

	// live triangle counts
	unsigned int* live_triangles = allocator.allocate<unsigned int>(vertex_count);
	memcpy(live_triangles, adjacency.counts, vertex_count * sizeof(unsigned int));

	// cache time stamps
	unsigned int* cache_timestamps = allocator.allocate<unsigned int>(vertex_count);
	memset(cache_timestamps, 0, vertex_count * sizeof(unsigned int));

	// dead-end stack
	unsigned int* dead_end = allocator.allocate<unsigned int>(index_count);
	unsigned int dead_end_top = 0;

	// emitted flags
	unsigned char* emitted_flags = allocator.allocate<unsigned char>(face_count);
	memset(emitted_flags, 0, face_count);

	unsigned int current_vertex = 0;

	unsigned int timestamp = cache_size + 1;
	unsigned int input_cursor = 1; // vertex to restart from in case of dead-end

	unsigned int output_triangle = 0;

	while (current_vertex != ~0u)
	{
		const unsigned int* next_candidates_begin = &dead_end[0] + dead_end_top;

		// emit all vertex neighbours
		const unsigned int* neighbours_begin = &adjacency.data[0] + adjacency.offsets[current_vertex];
		const unsigned int* neighbours_end = neighbours_begin + adjacency.counts[current_vertex];

		for (const unsigned int* it = neighbours_begin; it != neighbours_end; ++it)
		{
			unsigned int triangle = *it;

			if (!emitted_flags[triangle])
			{
				unsigned int a = indices[triangle * 3 + 0], b = indices[triangle * 3 + 1], c = indices[triangle * 3 + 2];

				// output indices
				destination[output_triangle * 3 + 0] = a;
				destination[output_triangle * 3 + 1] = b;
				destination[output_triangle * 3 + 2] = c;
				output_triangle++;

				// update dead-end stack
				dead_end[dead_end_top + 0] = a;
				dead_end[dead_end_top + 1] = b;
				dead_end[dead_end_top + 2] = c;
				dead_end_top += 3;

				// update live triangle counts
				live_triangles[a]--;
				live_triangles[b]--;
				live_triangles[c]--;

				// update cache info
				// if vertex is not in cache, put it in cache
				if (timestamp - cache_timestamps[a] > cache_size)
					cache_timestamps[a] = timestamp++;

				if (timestamp - cache_timestamps[b] > cache_size)
					cache_timestamps[b] = timestamp++;

				if (timestamp - cache_timestamps[c] > cache_size)
					cache_timestamps[c] = timestamp++;

				// update emitted flags
				emitted_flags[triangle] = true;
			}
		}

		// next candidates are the ones we pushed to dead-end stack just now
		const unsigned int* next_candidates_end = &dead_end[0] + dead_end_top;

		// get next vertex
		current_vertex = getNextVertexNeighbour(next_candidates_begin, next_candidates_end, &live_triangles[0], &cache_timestamps[0], timestamp, cache_size);

		if (current_vertex == ~0u)
		{
			current_vertex = getNextVertexDeadEnd(&dead_end[0], dead_end_top, input_cursor, &live_triangles[0], vertex_count);
		}
	}

	assert(output_triangle == face_count);
}